

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O3

int IDAGetCurrentYpSens(void *ida_mem,N_Vector **ypS)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x547,"IDAGetCurrentYpSens",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    *ypS = *(N_Vector **)((long)ida_mem + 0x398);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetCurrentYpSens(void* ida_mem, N_Vector** ypS)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *ypS = IDA_mem->ida_ypS;

  return (IDA_SUCCESS);
}